

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_DestroyDeviceObjects(void)

{
  if (g_VboHandle != 0) {
    (*__glewDeleteBuffers)(1,&g_VboHandle);
  }
  if (g_ElementsHandle != 0) {
    (*__glewDeleteBuffers)(1,&g_ElementsHandle);
  }
  g_ElementsHandle = 0;
  g_VboHandle = 0;
  if (g_VertHandle != 0 && g_ShaderHandle != 0) {
    (*__glewDetachShader)(g_ShaderHandle,g_VertHandle);
  }
  if (g_VertHandle != 0) {
    (*__glewDeleteShader)(g_VertHandle);
  }
  g_VertHandle = 0;
  if (g_FragHandle != 0 && g_ShaderHandle != 0) {
    (*__glewDetachShader)(g_ShaderHandle,g_FragHandle);
  }
  if (g_FragHandle != 0) {
    (*__glewDeleteShader)(g_FragHandle);
  }
  g_FragHandle = 0;
  if (g_ShaderHandle != 0) {
    (*__glewDeleteProgram)(g_ShaderHandle);
  }
  g_ShaderHandle = 0;
  ImGui_ImplOpenGL3_DestroyFontsTexture();
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_DestroyDeviceObjects()
{
    if (g_VboHandle) glDeleteBuffers(1, &g_VboHandle);
    if (g_ElementsHandle) glDeleteBuffers(1, &g_ElementsHandle);
    g_VboHandle = g_ElementsHandle = 0;

    if (g_ShaderHandle && g_VertHandle) glDetachShader(g_ShaderHandle, g_VertHandle);
    if (g_VertHandle) glDeleteShader(g_VertHandle);
    g_VertHandle = 0;

    if (g_ShaderHandle && g_FragHandle) glDetachShader(g_ShaderHandle, g_FragHandle);
    if (g_FragHandle) glDeleteShader(g_FragHandle);
    g_FragHandle = 0;

    if (g_ShaderHandle) glDeleteProgram(g_ShaderHandle);
    g_ShaderHandle = 0;

    ImGui_ImplOpenGL3_DestroyFontsTexture();
}